

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_smooth.c
# Opt level: O0

void process_iteration(Iterative_Method_parameters *method_parameters,Gas_parameters *gas_parameters
                      ,uint time_iter,uint space_iter,uint global_iter,double **results)

{
  clock_t start_time_00;
  clock_t finish_time_00;
  clock_t finish_time;
  clock_t start_time;
  double *space_coordinates;
  double *G;
  double *V;
  Node_status *node_statuses;
  Grid grid;
  double **results_local;
  uint global_iter_local;
  uint space_iter_local;
  uint time_iter_local;
  Gas_parameters *gas_parameters_local;
  Iterative_Method_parameters *method_parameters_local;
  
  grid.T_step = (double)results;
  grid_Initialize((Grid *)&node_statuses,gas_parameters,space_iter,time_iter);
  value_arrays_Construct(&space_coordinates,&G,(uint)node_statuses);
  mesh_elements_Construct((Node_status **)&V,(double **)&start_time,(uint)node_statuses);
  mesh_Initialize((Node_status *)V,(double *)start_time,(Grid *)&node_statuses);
  fill_mesh_at_initial_time
            (space_coordinates,G,g_start,u_start,(double *)start_time,(uint)node_statuses);
  start_time_00 = clock();
  find_approximate_solution
            (space_coordinates,G,(Node_status *)V,(double *)start_time,gas_parameters,
             (Grid *)&node_statuses,method_parameters);
  finish_time_00 = clock();
  write_current_results
            ((double **)grid.T_step,global_iter,start_time_00,finish_time_00,gas_parameters,
             method_parameters,(Grid *)&node_statuses,(double *)start_time,G,space_coordinates);
  print_results_at_current_iteration
            (*(double *)(*(long *)grid.T_step + (ulong)global_iter * 8),global_iter);
  value_arrays_Destruct(space_coordinates,G);
  mesh_elements_Destruct((Node_status *)V,(double *)start_time);
  return;
}

Assistant:

void process_iteration(Iterative_Method_parameters * method_parameters,
                       Gas_parameters * gas_parameters,
                       unsigned time_iter,
                       unsigned space_iter,
                       unsigned global_iter,
                       double ** results)
{
  Grid grid;
  Node_status * node_statuses;
  double * V;
  double * G;
  double * space_coordinates;
  clock_t start_time;
  clock_t finish_time;

  /* Initialize grid and mesh */
  grid_Initialize (&grid, gas_parameters, space_iter, time_iter);
  value_arrays_Construct (&G, &V, grid.X_nodes);
  mesh_elements_Construct (&node_statuses, &space_coordinates, grid.X_nodes);
  mesh_Initialize (node_statuses, space_coordinates, &grid);
  
  fill_mesh_at_initial_time (G, V, g_start, u_start, space_coordinates, grid.X_nodes); 

  /* Run the solver and calculate time */
  start_time = clock();
  find_approximate_solution (G, V, node_statuses, space_coordinates, gas_parameters,
                             &grid, method_parameters);
  finish_time = clock();

  write_current_results (results, global_iter, start_time, finish_time,
                         gas_parameters, method_parameters,
                         &grid, space_coordinates, V, G);

  /* Print results to file */
  print_results_at_current_iteration (results[0][global_iter], global_iter);
  global_iter++;

  /* Clean up */
  value_arrays_Destruct (G, V);
  mesh_elements_Destruct (node_statuses, space_coordinates);
}